

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O2

void DivVerifyUint64Int16_2(void)

{
  return;
}

Assistant:

void DivVerifyUint64Int16_2()
{
    TestVector< std::int16_t, std::uint64_t, OpType::Div2 > tests;
    TestCase< std::int16_t, std::uint64_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int32_t> si(test.x);
         SafeInt<std::int32_t> si2;

         si2 = test.y / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int16_uint64_2 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}